

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
draco::PlyReader::SplitWords
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PlyReader *this,string *line)

{
  char *pcVar1;
  string *psVar2;
  string *psVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  _Alloc_hider _Var7;
  long lVar8;
  string last_word;
  value_type local_58;
  string *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = std::__cxx11::string::find_first_of((char *)line,0x1a8952,0);
  psVar3 = line;
  psVar2 = local_38;
  while (local_38 = psVar3, lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)line);
    pcVar1 = local_58._M_dataplus._M_p + local_58._M_string_length;
    _Var7._M_p = local_58._M_dataplus._M_p;
    if (0 < (long)local_58._M_string_length >> 2) {
      _Var7._M_p = local_58._M_dataplus._M_p + (local_58._M_string_length & 0xfffffffffffffffc);
      lVar8 = ((long)local_58._M_string_length >> 2) + 1;
      pcVar6 = local_58._M_dataplus._M_p + 3;
      do {
        iVar4 = isspace((int)pcVar6[-3]);
        if (iVar4 == 0) {
          pcVar6 = pcVar6 + -3;
          goto LAB_0011f647;
        }
        iVar4 = isspace((int)pcVar6[-2]);
        if (iVar4 == 0) {
          pcVar6 = pcVar6 + -2;
          goto LAB_0011f647;
        }
        iVar4 = isspace((int)pcVar6[-1]);
        if (iVar4 == 0) {
          pcVar6 = pcVar6 + -1;
          goto LAB_0011f647;
        }
        iVar4 = isspace((int)*pcVar6);
        if (iVar4 == 0) goto LAB_0011f647;
        lVar8 = lVar8 + -1;
        pcVar6 = pcVar6 + 4;
      } while (1 < lVar8);
    }
    lVar8 = (long)pcVar1 - (long)_Var7._M_p;
    if (lVar8 == 1) {
LAB_0011f623:
      iVar4 = isspace((int)*_Var7._M_p);
      pcVar6 = _Var7._M_p;
      if (iVar4 != 0) {
        pcVar6 = pcVar1;
      }
    }
    else if (lVar8 == 2) {
LAB_0011f612:
      iVar4 = isspace((int)*_Var7._M_p);
      pcVar6 = _Var7._M_p;
      if (iVar4 != 0) {
        _Var7._M_p = _Var7._M_p + 1;
        goto LAB_0011f623;
      }
    }
    else {
      pcVar6 = pcVar1;
      if ((lVar8 == 3) && (iVar4 = isspace((int)*_Var7._M_p), pcVar6 = _Var7._M_p, iVar4 != 0)) {
        _Var7._M_p = _Var7._M_p + 1;
        goto LAB_0011f612;
      }
    }
LAB_0011f647:
    if (pcVar6 != pcVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_58);
    }
    line = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lVar5 = std::__cxx11::string::find_first_of((char *)line,0x1a8952,lVar5 + 1);
    psVar3 = local_38;
    psVar2 = local_38;
  }
  local_38 = psVar2;
  std::__cxx11::string::substr((ulong)&local_58,(ulong)line);
  pcVar1 = local_58._M_dataplus._M_p + local_58._M_string_length;
  _Var7._M_p = local_58._M_dataplus._M_p;
  if (0 < (long)local_58._M_string_length >> 2) {
    _Var7._M_p = local_58._M_dataplus._M_p + (local_58._M_string_length & 0xfffffffffffffffc);
    lVar5 = ((long)local_58._M_string_length >> 2) + 1;
    pcVar6 = local_58._M_dataplus._M_p + 3;
    do {
      iVar4 = isspace((int)pcVar6[-3]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -3;
        goto LAB_0011f795;
      }
      iVar4 = isspace((int)pcVar6[-2]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -2;
        goto LAB_0011f795;
      }
      iVar4 = isspace((int)pcVar6[-1]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -1;
        goto LAB_0011f795;
      }
      iVar4 = isspace((int)*pcVar6);
      if (iVar4 == 0) goto LAB_0011f795;
      lVar5 = lVar5 + -1;
      pcVar6 = pcVar6 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)_Var7._M_p;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar6 = pcVar1;
      if ((lVar5 != 3) || (iVar4 = isspace((int)*_Var7._M_p), pcVar6 = _Var7._M_p, iVar4 == 0))
      goto LAB_0011f795;
      _Var7._M_p = _Var7._M_p + 1;
    }
    iVar4 = isspace((int)*_Var7._M_p);
    pcVar6 = _Var7._M_p;
    if (iVar4 == 0) goto LAB_0011f795;
    _Var7._M_p = _Var7._M_p + 1;
  }
  iVar4 = isspace((int)*_Var7._M_p);
  pcVar6 = _Var7._M_p;
  if (iVar4 != 0) {
    pcVar6 = pcVar1;
  }
LAB_0011f795:
  if (pcVar6 != pcVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PlyReader::SplitWords(const std::string &line) {
  std::vector<std::string> output;
  std::string::size_type start = 0;
  std::string::size_type end = 0;

  // Check for isspace chars.
  while ((end = line.find_first_of(" \t\n\v\f\r", start)) !=
         std::string::npos) {
    const std::string word(line.substr(start, end - start));
    if (!std::all_of(word.begin(), word.end(), isspace)) {
      output.push_back(word);
    }
    start = end + 1;
  }

  const std::string last_word(line.substr(start));
  if (!std::all_of(last_word.begin(), last_word.end(), isspace)) {
    output.push_back(last_word);
  }
  return output;
}